

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O2

void cf_socket_close(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  connectdata *conn;
  curl_socket_t sock;
  
  pvVar1 = cf->ctx;
  if (pvVar1 != (void *)0x0) {
    sock = *(int *)((long)pvVar1 + 0x98);
    if (sock != -1) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
         (0 < cf->cft->log_level)) {
        Curl_trc_cf_infof(data,cf,"cf_socket_close(%d)");
        sock = *(int *)((long)pvVar1 + 0x98);
      }
      conn = cf->conn;
      if (sock == conn->sock[cf->sockindex]) {
        conn->sock[cf->sockindex] = -1;
        sock = *(curl_socket_t *)((long)pvVar1 + 0x98);
      }
      socket_close(data,conn,(uint)((*(byte *)((long)pvVar1 + 0x17c) & 2) == 0),sock);
      *(undefined4 *)((long)pvVar1 + 0x98) = 0xffffffff;
      if (((*(byte *)((long)pvVar1 + 0x17c) & 8) != 0) && (cf->sockindex == 0)) {
        cf->conn->remote_addr = (Curl_sockaddr_ex *)0x0;
      }
      Curl_bufq_reset((bufq *)((long)pvVar1 + 0xa0));
      *(byte *)((long)pvVar1 + 0x17c) = *(byte *)((long)pvVar1 + 0x17c) & 0xe7;
      *(undefined8 *)((long)pvVar1 + 0x148) = 0;
      *(undefined8 *)((long)pvVar1 + 0x150) = 0;
      *(undefined8 *)((long)pvVar1 + 0x158) = 0;
      *(undefined8 *)((long)pvVar1 + 0x160) = 0;
    }
  }
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  return;
}

Assistant:

static void cf_socket_close(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  if(ctx && CURL_SOCKET_BAD != ctx->sock) {
    CURL_TRC_CF(data, cf, "cf_socket_close(%" CURL_FORMAT_SOCKET_T
                ")", ctx->sock);
    if(ctx->sock == cf->conn->sock[cf->sockindex])
      cf->conn->sock[cf->sockindex] = CURL_SOCKET_BAD;
    socket_close(data, cf->conn, !ctx->accepted, ctx->sock);
    ctx->sock = CURL_SOCKET_BAD;
    if(ctx->active && cf->sockindex == FIRSTSOCKET)
      cf->conn->remote_addr = NULL;
    Curl_bufq_reset(&ctx->recvbuf);
    ctx->active = FALSE;
    ctx->buffer_recv = FALSE;
    memset(&ctx->started_at, 0, sizeof(ctx->started_at));
    memset(&ctx->connected_at, 0, sizeof(ctx->connected_at));
  }

  cf->connected = FALSE;
}